

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

bool __thiscall UtestShell::match(UtestShell *this,char *target,TestFilter *filters)

{
  bool bVar1;
  SimpleString local_30;
  
  if (filters == (TestFilter *)0x0) {
    bVar1 = true;
  }
  else {
    do {
      SimpleString::SimpleString(&local_30,target);
      bVar1 = TestFilter::match(filters,&local_30);
      SimpleString::~SimpleString(&local_30);
      if (bVar1) {
        return bVar1;
      }
      filters = TestFilter::getNext(filters);
    } while (filters != (TestFilter *)0x0);
  }
  return bVar1;
}

Assistant:

bool UtestShell::match(const char* target, const TestFilter* filters) const
{
    if(filters == NULLPTR) return true;

    for(; filters != NULLPTR; filters = filters->getNext())
        if(filters->match(target)) return true;

    return false;
}